

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O3

void __thiscall
feintrack::SimpleLeftObjectsDetector::NewLeftObject
          (SimpleLeftObjectsDetector *this,uint obj_uid,CObjectRegion *region)

{
  size_t *psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  _List_node_base *p_Var8;
  
  iVar2 = this->left_object_time3;
  iVar3 = this->left_object_time1;
  iVar4 = CObjectRegion::get_left(region);
  iVar5 = CObjectRegion::get_right(region);
  iVar6 = CObjectRegion::get_top(region);
  iVar7 = CObjectRegion::get_bottom(region);
  p_Var8 = (_List_node_base *)operator_new(0x28);
  *(int *)&p_Var8[1]._M_next = iVar2 - iVar3;
  *(int *)((long)&p_Var8[1]._M_next + 4) = iVar4;
  *(int *)&p_Var8[1]._M_prev = iVar5;
  *(int *)((long)&p_Var8[1]._M_prev + 4) = iVar6;
  *(int *)&p_Var8[2]._M_next = iVar7;
  *(uint *)((long)&p_Var8[2]._M_next + 4) = obj_uid;
  std::__detail::_List_node_base::_M_hook(p_Var8);
  psVar1 = &(this->lefted_objects).
            super__List_base<feintrack::CLeftObjView,_std::allocator<feintrack::CLeftObjView>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void SimpleLeftObjectsDetector::NewLeftObject(
        unsigned int obj_uid,
        const CObjectRegion& region
        )
{
    lefted_objects.push_back(CLeftObjView(left_object_time3 - left_object_time1,
                                          region.get_left(), region.get_right(), region.get_top(), region.get_bottom(),
                                          obj_uid));
}